

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_map_sync_write
          (t_rs_generator *this,string *map_var,bool map_var_is_ref,t_map *tmap)

{
  t_type *ptVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_1c0;
  string local_1a0;
  allocator local_179;
  string local_178;
  string local_158;
  allocator local_131;
  string local_130;
  string local_110;
  string local_f0;
  allocator local_c9;
  string local_c8 [8];
  string ref;
  string local_88;
  string local_58;
  t_type *local_38;
  t_type *val_type;
  t_type *key_type;
  t_map *tmap_local;
  string *psStack_18;
  bool map_var_is_ref_local;
  string *map_var_local;
  t_rs_generator *this_local;
  
  key_type = (t_type *)tmap;
  tmap_local._7_1_ = map_var_is_ref;
  psStack_18 = map_var;
  map_var_local = (string *)this;
  val_type = t_map::get_key_type(tmap);
  local_38 = t_map::get_val_type((t_map *)key_type);
  t_generator::indent_abi_cxx11_(&local_58,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_58);
  poVar2 = std::operator<<(poVar2,"o_prot.write_map_begin(");
  poVar2 = std::operator<<(poVar2,"&TMapIdentifier::new(");
  to_rust_field_type_enum_abi_cxx11_(&local_88,this,val_type);
  poVar2 = std::operator<<(poVar2,(string *)&local_88);
  poVar2 = std::operator<<(poVar2,", ");
  to_rust_field_type_enum_abi_cxx11_((string *)((long)&ref.field_2 + 8),this,local_38);
  poVar2 = std::operator<<(poVar2,(string *)(ref.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(poVar2,(string *)psStack_18);
  poVar2 = std::operator<<(poVar2,".len() as i32)");
  poVar2 = std::operator<<(poVar2,")?;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(ref.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_58);
  pcVar3 = "&";
  if ((tmap_local._7_1_ & 1) != 0) {
    pcVar3 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,pcVar3,&local_c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_f0);
  poVar2 = std::operator<<(poVar2,"for (k, v) in ");
  poVar2 = std::operator<<(poVar2,local_c8);
  poVar2 = std::operator<<(poVar2,(string *)psStack_18);
  poVar2 = std::operator<<(poVar2," {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f0);
  t_generator::indent_up(&this->super_t_generator);
  ptVar1 = val_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"k",&local_131);
  string_container_write_variable(&local_110,this,ptVar1,&local_130);
  render_type_sync_write(this,&local_110,true,val_type);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  ptVar1 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"v",&local_179);
  string_container_write_variable(&local_158,this,ptVar1,&local_178);
  render_type_sync_write(this,&local_158,true,local_38);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_1a0,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_1a0);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1a0);
  t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"o_prot.write_map_end()?;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string(local_c8);
  return;
}

Assistant:

void t_rs_generator::render_map_sync_write(const string &map_var, bool map_var_is_ref, t_map *tmap) {
  t_type* key_type = tmap->get_key_type();
  t_type* val_type = tmap->get_val_type();

  f_gen_
    << indent()
    << "o_prot.write_map_begin("
    << "&TMapIdentifier::new("
    << to_rust_field_type_enum(key_type) << ", "
    << to_rust_field_type_enum(val_type) << ", "
    << map_var << ".len() as i32)"
    << ")?;"
    << endl;

  string ref(map_var_is_ref ? "" : "&");
  f_gen_ << indent() << "for (k, v) in " << ref << map_var << " {" << endl;
  indent_up();
  render_type_sync_write(string_container_write_variable(key_type, "k"), true, key_type);
  render_type_sync_write(string_container_write_variable(val_type, "v"), true, val_type);
  indent_down();
  f_gen_ << indent() << "}" << endl;
  f_gen_ << indent() << "o_prot.write_map_end()?;" << endl;
}